

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_boolean<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  basic_value<toml::type_config> *v;
  string *this;
  string str;
  region reg;
  allocator<char> local_3aa;
  allocator<char> local_3a9;
  undefined1 local_3a8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  string local_368;
  string local_348;
  region local_328;
  location local_2c0;
  undefined1 local_278 [200];
  region local_1b0;
  basic_value<toml::type_config> local_148;
  error_info local_80;
  
  syntax::boolean((either *)local_278,&ctx->toml_spec_);
  either::scan(&local_328,(either *)local_278,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_278 + 8));
  if (local_328.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,
               "toml::parse_boolean: invalid boolean: boolean must be `true` or `false`, in lowercase. string must be surrounded by `\"`"
               ,&local_3a9);
    syntax::boolean((either *)local_3a8,&ctx->toml_spec_);
    location::location(&local_2c0,loc);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"",&local_3aa);
    make_syntax_error<toml::detail::either>
              ((error_info *)local_278,&local_348,(either *)local_3a8,&local_2c0,&local_368);
    err<toml::error_info>((failure<toml::error_info> *)&local_80,(error_info *)local_278);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_80);
    error_info::~error_info(&local_80);
    error_info::~error_info((error_info *)local_278);
    std::__cxx11::string::~string((string *)&local_368);
    location::~location(&local_2c0);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )(local_3a8 + 8));
    this = &local_348;
  }
  else {
    region::as_string_abi_cxx11_((string *)local_3a8,&local_328);
    local_278._0_8_ = (string *)local_3a8;
    bVar1 = parse_boolean<toml::type_config>::anon_class_8_1_ba1d7991::operator()
                      ((anon_class_8_1_ba1d7991 *)local_278);
    local_388.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_388.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_388.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    region::region(&local_1b0,&local_328);
    basic_value<toml::type_config>::basic_value
              ((basic_value<toml::type_config> *)local_278,bVar1,&local_388,&local_1b0);
    ok<toml::basic_value<toml::type_config>>
              ((success<toml::basic_value<toml::type_config>_> *)&local_148,(toml *)local_278,v);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(success_type *)&local_148);
    basic_value<toml::type_config>::~basic_value(&local_148);
    basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)local_278);
    region::~region(&local_1b0);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_388);
    this = (string *)local_3a8;
  }
  std::__cxx11::string::~string((string *)this);
  region::~region(&local_328);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_boolean(location& loc, const context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();

    // ----------------------------------------------------------------------
    // check syntax
    auto reg = syntax::boolean(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_boolean: "
            "invalid boolean: boolean must be `true` or `false`, in lowercase. "
            "string must be surrounded by `\"`", syntax::boolean(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value
    const auto str = reg.as_string();
    const auto val = [&str]() {
        if(str == "true")
        {
            return true;
        }
        else
        {
            assert(str == "false");
            return false;
        }
    }();

    // ----------------------------------------------------------------------
    // no format info for boolean
    boolean_format_info fmt;

    return ok(basic_value<TC>(val, std::move(fmt), {}, std::move(reg)));
}